

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_create(uchar **out,size_t *outlength,uint length,char *type,uchar *data)

{
  uint uVar1;
  uchar *puVar2;
  uint *chunk;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)length;
  uVar3 = uVar5 + 0xc + *outlength;
  uVar1 = 0x4d;
  if (length + 0xc <= uVar3 && !CARRY8(uVar5 + 0xc,*outlength)) {
    puVar2 = (uchar *)realloc(*out,uVar3);
    if (puVar2 == (uchar *)0x0) {
      uVar1 = 0x53;
    }
    else {
      *out = puVar2;
      *outlength = uVar3;
      puVar2 = *out;
      lVar4 = uVar3 - uVar5;
      chunk = (uint *)(puVar2 + lVar4 + -0xc);
      *chunk = length >> 0x18 | (length & 0xff0000) >> 8 | (length & 0xff00) << 8 | length << 0x18;
      puVar2[lVar4 + -8] = *type;
      puVar2[lVar4 + -7] = type[1];
      puVar2[lVar4 + -6] = type[2];
      puVar2[lVar4 + -5] = type[3];
      if (length != 0) {
        uVar3 = 8;
        do {
          *(uchar *)((long)chunk + (uVar3 & 0xffffffff)) = data[uVar3 - 8];
          lVar4 = uVar3 - uVar5;
          uVar3 = uVar3 + 1;
        } while (lVar4 != 7);
      }
      lodepng_chunk_generate_crc((uchar *)chunk);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned lodepng_chunk_create(unsigned char** out, size_t* outlength, unsigned length,
	const char* type, const unsigned char* data)
{
	unsigned i;
	unsigned char *chunk, *new_buffer;
	size_t new_length = (*outlength) + length + 12;
	if (new_length < length + 12 || new_length < (*outlength)) return 77; /*integer overflow happened*/
	new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
	if (!new_buffer) return 83; /*alloc fail*/
	(*out) = new_buffer;
	(*outlength) = new_length;
	chunk = &(*out)[(*outlength) - length - 12];

	/*1: length*/
	lodepng_set32bitInt(chunk, (unsigned)length);

	/*2: chunk name (4 letters)*/
	chunk[4] = (unsigned char)type[0];
	chunk[5] = (unsigned char)type[1];
	chunk[6] = (unsigned char)type[2];
	chunk[7] = (unsigned char)type[3];

	/*3: the data*/
	for (i = 0; i != length; ++i) chunk[8 + i] = data[i];

	/*4: CRC (of the chunkname characters and the data)*/
	lodepng_chunk_generate_crc(chunk);

	return 0;
}